

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonTypeFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  JsonParse *pParse;
  uchar *zPath;
  JsonNode *pJVar1;
  
  pParse = jsonParseCached(ctx,argv,ctx);
  if (pParse != (JsonParse *)0x0) {
    if (argc == 2) {
      zPath = sqlite3_value_text(argv[1]);
      pJVar1 = jsonLookup(pParse,(char *)zPath,(int *)0x0,ctx);
    }
    else {
      pJVar1 = pParse->aNode;
    }
    if (pJVar1 != (JsonNode *)0x0) {
      sqlite3_result_text(ctx,jsonType[pJVar1->eType],-1,(_func_void_void_ptr *)0x0);
      return;
    }
  }
  return;
}

Assistant:

static void jsonTypeFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  const char *zPath;
  JsonNode *pNode;

  p = jsonParseCached(ctx, argv, ctx);
  if( p==0 ) return;
  if( argc==2 ){
    zPath = (const char*)sqlite3_value_text(argv[1]);
    pNode = jsonLookup(p, zPath, 0, ctx);
  }else{
    pNode = p->aNode;
  }
  if( pNode ){
    sqlite3_result_text(ctx, jsonType[pNode->eType], -1, SQLITE_STATIC);
  }
}